

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStaticConstructor
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *code,IDLOptions *options)

{
  string params;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  function<void_()> local_b8;
  string local_98;
  string local_78;
  string local_58;
  anon_class_24_3_05e67fb7 local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"",(allocator<char> *)&local_d8);
  StructConstructorParams(&local_58,this,struct_def,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"create",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_fa);
  IdlNamer::LegacyJavaMethod2(&local_f8,&this->namer_,&local_d8,struct_def,&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Int",&local_fb);
  local_38.this = this;
  local_38.struct_def = struct_def;
  local_38.code = code;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinGenerator::GenerateStaticConstructor(flatbuffers::StructDef_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_b8,&local_38);
  GenerateFun(code,&local_f8,&local_58,&local_98,&local_b8,options->gen_jvmstatic);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void GenerateStaticConstructor(const StructDef &struct_def, CodeWriter &code,
                                 const IDLOptions options) const {
    // create a struct constructor function
    auto params = StructConstructorParams(struct_def);
    GenerateFun(
        code, namer_.LegacyJavaMethod2("create", struct_def, ""), params, "Int",
        [&]() {
          GenStructBody(struct_def, code, "");
          code += "return builder.offset()";
        },
        options.gen_jvmstatic);
  }